

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  Token *pTVar1;
  Scanner *in_RDI;
  EventHandler *in_stack_000000f8;
  SingleDocParser *in_stack_00000100;
  EventHandler *in_stack_00000108;
  SingleDocParser *in_stack_00000110;
  
  pTVar1 = Scanner::peek(in_RDI);
  if (pTVar1->type == BLOCK_SEQ_START) {
    HandleBlockSequence(in_stack_00000110,in_stack_00000108);
  }
  else if (pTVar1->type == FLOW_SEQ_START) {
    HandleFlowSequence(in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

void SingleDocParser::HandleSequence(EventHandler& eventHandler) {
  // split based on start token
  switch (m_scanner.peek().type) {
    case Token::BLOCK_SEQ_START:
      HandleBlockSequence(eventHandler);
      break;
    case Token::FLOW_SEQ_START:
      HandleFlowSequence(eventHandler);
      break;
    default:
      break;
  }
}